

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash_xo_len_65_to_96(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long in_RSI;
  uint64_t h2;
  uint64_t h1;
  uint64_t h0;
  uint64_t mul1;
  uint64_t mul0;
  
  uVar1 = farmhash_xo_h32((char *)mul0,mul1,h0,h1,h2);
  uVar2 = farmhash_xo_h32((char *)mul0,mul1,h0,h1,h2);
  uVar3 = farmhash_xo_h32((char *)mul0,mul1,h0,h1,h2);
  return (uVar3 * 9 + (uVar1 >> 0x11) + (uVar2 >> 0x15)) * (in_RSI * 2 + -0x651e95c4d06fc023);
}

Assistant:

static inline uint64_t farmhash_xo_len_65_to_96(const char *s, size_t len) {
  uint64_t mul0 = k2 - 114;
  uint64_t mul1 = k2 - 114 + 2 * len;
  uint64_t h0 = farmhash_xo_h32(s, 32, mul0, 0, 0);
  uint64_t h1 = farmhash_xo_h32(s + 32, 32, mul1, 0, 0);
  uint64_t h2 = farmhash_xo_h32(s + len - 32, 32, mul1, h0, h1);
  return (h2 * 9 + (h0 >> 17) + (h1 >> 21)) * mul1;
}